

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

int mbedtls_des_crypt_ecb(mbedtls_des_context *ctx,uchar *input,uchar *output)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = *(uint *)input;
  uVar4 = *(uint *)(input + 4);
  uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar4 = (uVar2 >> 4 ^ uVar1) & 0xf0f0f0f;
  uVar1 = uVar1 ^ uVar4;
  uVar2 = uVar4 << 4 ^ uVar2;
  uVar4 = uVar1 & 0xffff ^ uVar2 >> 0x10;
  uVar1 = uVar1 ^ uVar4;
  uVar2 = uVar4 << 0x10 ^ uVar2;
  uVar4 = (uVar1 >> 2 ^ uVar2) & 0x33333333;
  uVar2 = uVar2 ^ uVar4;
  uVar1 = uVar4 << 2 ^ uVar1;
  uVar4 = (uVar1 >> 8 ^ uVar2) & 0xff00ff;
  uVar2 = uVar2 ^ uVar4;
  uVar1 = uVar4 << 8 ^ uVar1;
  uVar4 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar1 = (uVar4 ^ uVar2) & 0xaaaaaaaa;
  uVar4 = uVar4 ^ uVar1;
  uVar1 = uVar1 ^ uVar2;
  uVar1 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  lVar3 = 0;
  do {
    uVar2 = *(uint *)((long)ctx->sk + lVar3) ^ uVar4;
    uVar5 = (uVar4 << 0x1c | uVar4 >> 4) ^ *(uint *)((long)ctx->sk + lVar3 + 4);
    uVar1 = uVar1 ^ SB8[uVar2 & 0x3f] ^ *(uint *)((long)SB6 + (ulong)(uVar2 >> 6 & 0xfc)) ^
            *(uint *)((long)SB4 + (ulong)(uVar2 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB2 + (ulong)(uVar2 >> 0x16 & 0xfc)) ^ SB7[uVar5 & 0x3f] ^
            *(uint *)((long)SB5 + (ulong)(uVar5 >> 6 & 0xfc)) ^
            *(uint *)((long)SB3 + (ulong)(uVar5 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB1 + (ulong)(uVar5 >> 0x16 & 0xfc));
    uVar5 = *(uint *)((long)ctx->sk + lVar3 + 8) ^ uVar1;
    uVar2 = (uVar1 << 0x1c | uVar1 >> 4) ^ *(uint *)((long)ctx->sk + lVar3 + 0xc);
    uVar4 = SB8[uVar5 & 0x3f] ^ *(uint *)((long)SB6 + (ulong)(uVar5 >> 6 & 0xfc)) ^
            *(uint *)((long)SB4 + (ulong)(uVar5 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB2 + (ulong)(uVar5 >> 0x16 & 0xfc)) ^ SB7[uVar2 & 0x3f] ^
            *(uint *)((long)SB5 + (ulong)(uVar2 >> 6 & 0xfc)) ^
            *(uint *)((long)SB3 + (ulong)(uVar2 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB1 + (ulong)(uVar2 >> 0x16 & 0xfc)) ^ uVar4;
    lVar3 = lVar3 + 0x10;
  } while ((int)lVar3 != 0x80);
  uVar2 = uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f;
  uVar4 = (uVar2 ^ uVar1) & 0xaaaaaaaa;
  uVar2 = uVar2 ^ uVar4;
  uVar4 = uVar4 ^ uVar1;
  uVar4 = uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f;
  uVar1 = (uVar4 >> 8 ^ uVar2) & 0xff00ff;
  uVar2 = uVar2 ^ uVar1;
  uVar4 = uVar1 << 8 ^ uVar4;
  uVar1 = (uVar4 >> 2 ^ uVar2) & 0x33333333;
  uVar2 = uVar2 ^ uVar1;
  uVar4 = uVar1 << 2 ^ uVar4;
  uVar1 = uVar4 & 0xffff ^ uVar2 >> 0x10;
  uVar4 = uVar4 ^ uVar1;
  uVar2 = uVar1 << 0x10 ^ uVar2;
  uVar1 = (uVar2 >> 4 ^ uVar4) & 0xf0f0f0f;
  uVar4 = uVar4 ^ uVar1;
  uVar2 = uVar1 << 4 ^ uVar2;
  *output = (uchar)(uVar2 >> 0x18);
  output[1] = (uchar)(uVar2 >> 0x10);
  output[2] = (uchar)(uVar2 >> 8);
  output[3] = (uchar)uVar2;
  output[4] = (uchar)(uVar4 >> 0x18);
  output[5] = (uchar)(uVar4 >> 0x10);
  output[6] = (uchar)(uVar4 >> 8);
  output[7] = (uchar)uVar4;
  return 0;
}

Assistant:

int mbedtls_des_crypt_ecb( mbedtls_des_context *ctx,
                    const unsigned char input[8],
                    unsigned char output[8] )
{
    int i;
    uint32_t X, Y, T, *SK;

    SK = ctx->sk;

    GET_UINT32_BE( X, input, 0 );
    GET_UINT32_BE( Y, input, 4 );

    DES_IP( X, Y );

    for( i = 0; i < 8; i++ )
    {
        DES_ROUND( Y, X );
        DES_ROUND( X, Y );
    }

    DES_FP( Y, X );

    PUT_UINT32_BE( Y, output, 0 );
    PUT_UINT32_BE( X, output, 4 );

    return( 0 );
}